

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O0

void __thiscall
compressed_array_check_size_check_Test::~compressed_array_check_size_check_Test
          (compressed_array_check_size_check_Test *this)

{
  testing::Test::~Test((Test *)0x11237e);
  return;
}

Assistant:

TEST(compressed_array_check, size_check) {
    vector<Record> records;

    records = create_records_1();
    ASSERT_EQ(records.size(), CompressedArray(records).size());

    records = create_records_2();
    ASSERT_EQ(records.size(), CompressedArray(records).size());

    records = create_records_3();
    ASSERT_EQ(records.size(), CompressedArray(records).size());
}